

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::FunctionStatement(SQCompiler *this)

{
  SQObjectType SVar1;
  SQInteger SVar2;
  SQObjectValue this_00;
  SQCompiler *in_RDI;
  SQObject SVar3;
  SQInteger in_stack_00000020;
  SQCompiler *in_stack_00000028;
  bool in_stack_00000067;
  SQObject *in_stack_00000068;
  SQObject id;
  SQCompiler *in_stack_ffffffffffffff80;
  SQFuncState *in_stack_ffffffffffffff88;
  SQFuncState *in_stack_ffffffffffffff90;
  SQInteger in_stack_ffffffffffffff98;
  SQLocalVarInfo *arg0;
  SQOpcode _op;
  undefined4 in_stack_ffffffffffffffdc;
  
  Lex(in_stack_ffffffffffffff80);
  SVar3 = Expect(in_stack_00000028,in_stack_00000020);
  this_00 = SVar3._unVal;
  SVar1 = SVar3._type;
  SQFuncState::PushTarget(in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80);
  arg0 = ((SQLocalVarInfoVec *)&in_RDI->_fs)->_vals;
  SVar2 = SQFuncState::PushTarget(in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80);
  SQFuncState::GetConstant
            ((SQFuncState *)this_00.pTable,(SQObject *)CONCAT44(in_stack_ffffffffffffffdc,SVar1));
  SQFuncState::AddInstruction
            ((SQFuncState *)in_RDI,(SQOpcode)((ulong)SVar2 >> 0x20),(SQInteger)arg0,
             in_stack_ffffffffffffff98,(SQInteger)in_stack_ffffffffffffff90,
             (SQInteger)in_stack_ffffffffffffff88);
  if (in_RDI->_token == 299) {
    Emit2ArgsOP(in_RDI,(SQOpcode)((ulong)SVar2 >> 0x20),(SQInteger)arg0);
  }
  while (_op = (SQOpcode)((ulong)SVar2 >> 0x20), in_RDI->_token == 299) {
    Lex(in_stack_ffffffffffffff80);
    Expect(in_stack_00000028,in_stack_00000020);
    in_stack_ffffffffffffff90 = in_RDI->_fs;
    in_stack_ffffffffffffff98 =
         SQFuncState::PushTarget(in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80);
    SQFuncState::GetConstant
              ((SQFuncState *)this_00.pTable,(SQObject *)CONCAT44(in_stack_ffffffffffffffdc,SVar1));
    SQFuncState::AddInstruction
              ((SQFuncState *)in_RDI,(SQOpcode)((ulong)SVar2 >> 0x20),(SQInteger)arg0,
               in_stack_ffffffffffffff98,(SQInteger)in_stack_ffffffffffffff90,
               (SQInteger)in_stack_ffffffffffffff88);
    if (in_RDI->_token == 299) {
      Emit2ArgsOP(in_RDI,(SQOpcode)((ulong)SVar2 >> 0x20),(SQInteger)arg0);
    }
  }
  Expect(in_stack_00000028,in_stack_00000020);
  CreateFunction((SQCompiler *)id._0_8_,in_stack_00000068,in_stack_00000067);
  SVar2 = SQFuncState::PushTarget(in_stack_ffffffffffffff88,(SQInteger)in_RDI->_fs);
  sqvector<SQObjectPtr>::size(&in_RDI->_fs->_functions);
  SQFuncState::AddInstruction
            ((SQFuncState *)in_RDI,_op,(SQInteger)arg0,in_stack_ffffffffffffff98,
             (SQInteger)in_stack_ffffffffffffff90,SVar2);
  EmitDerefOp(in_RDI,_op);
  SQFuncState::PopTarget(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void FunctionStatement()
    {
        SQObject id;
        Lex(); id = Expect(TK_IDENTIFIER);
        _fs->PushTarget(0);
        _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
        if(_token == TK_DOUBLE_COLON) Emit2ArgsOP(_OP_GET);

        while(_token == TK_DOUBLE_COLON) {
            Lex();
            id = Expect(TK_IDENTIFIER);
            _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
            if(_token == TK_DOUBLE_COLON) Emit2ArgsOP(_OP_GET);
        }
        Expect(_SC('('));
        CreateFunction(id);
        _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
        EmitDerefOp(_OP_NEWSLOT);
        _fs->PopTarget();
    }